

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_Mux(Ivy_Man_t *p,Ivy_Obj_t *pC,Ivy_Obj_t *p1,Ivy_Obj_t *p0)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Type_t IVar6;
  Ivy_Init_t in_R8D;
  Ivy_Obj_t *pIVar7;
  Ivy_Obj_t *local_60;
  
  pIVar7 = (Ivy_Obj_t *)((ulong)p1 ^ 1);
  if (pIVar7 == p0) {
    pIVar7 = Ivy_Exor(p,pC,p0);
    return pIVar7;
  }
  pIVar2 = p0;
  pIVar1 = Ivy_ObjCreateGhost(p,pC,p1,(Ivy_Type_t)p0,in_R8D);
  IVar6 = (Ivy_Type_t)pIVar2;
  local_60 = Ivy_TableLookup(p,pIVar1);
  pIVar1 = (Ivy_Obj_t *)((ulong)pC ^ 1);
  pIVar2 = Ivy_ObjCreateGhost(p,pIVar1,p0,IVar6,in_R8D);
  pIVar2 = Ivy_TableLookup(p,pIVar2);
  if ((local_60 != (Ivy_Obj_t *)0x0) && (pIVar2 != (Ivy_Obj_t *)0x0)) {
    pIVar3 = Ivy_ObjCreateGhost(p,(Ivy_Obj_t *)((ulong)local_60 ^ 1),
                                (Ivy_Obj_t *)((ulong)pIVar2 ^ 1),(Ivy_Type_t)pIVar2,in_R8D);
    pIVar3 = Ivy_TableLookup(p,pIVar3);
    if (pIVar3 != (Ivy_Obj_t *)0x0) goto LAB_00657919;
  }
  pIVar3 = pIVar2;
  pIVar4 = Ivy_ObjCreateGhost(p,pC,pIVar7,(Ivy_Type_t)pIVar2,in_R8D);
  IVar6 = (Ivy_Type_t)pIVar3;
  pIVar3 = Ivy_TableLookup(p,pIVar4);
  pIVar4 = Ivy_ObjCreateGhost(p,pIVar1,(Ivy_Obj_t *)((ulong)p0 ^ 1),IVar6,in_R8D);
  pIVar4 = Ivy_TableLookup(p,pIVar4);
  if ((pIVar3 != (Ivy_Obj_t *)0x0) && (pIVar4 != (Ivy_Obj_t *)0x0)) {
    pIVar5 = Ivy_ObjCreateGhost(p,(Ivy_Obj_t *)((ulong)pIVar3 ^ 1),(Ivy_Obj_t *)((ulong)pIVar4 ^ 1),
                                IVar6,in_R8D);
    pIVar5 = Ivy_TableLookup(p,pIVar5);
    if (pIVar5 != (Ivy_Obj_t *)0x0) {
      return pIVar5;
    }
  }
  if (((pIVar4 != (Ivy_Obj_t *)0x0) + 1) - (uint)(pIVar3 == (Ivy_Obj_t *)0x0) <=
      ((pIVar2 != (Ivy_Obj_t *)0x0) + 1) - (uint)(local_60 == (Ivy_Obj_t *)0x0)) {
    if (local_60 == (Ivy_Obj_t *)0x0) {
      local_60 = Ivy_And(p,pC,p1);
    }
    if (pIVar2 == (Ivy_Obj_t *)0x0) {
      pIVar2 = Ivy_And(p,pIVar1,p0);
    }
    pIVar7 = Ivy_Or(p,local_60,pIVar2);
    return pIVar7;
  }
  if (pIVar3 == (Ivy_Obj_t *)0x0) {
    pIVar3 = Ivy_And(p,pC,pIVar7);
  }
  if (pIVar4 == (Ivy_Obj_t *)0x0) {
    pIVar4 = Ivy_And(p,pIVar1,(Ivy_Obj_t *)((ulong)p0 ^ 1));
  }
  pIVar3 = Ivy_Or(p,pIVar3,pIVar4);
LAB_00657919:
  return (Ivy_Obj_t *)((ulong)pIVar3 ^ 1);
}

Assistant:

Ivy_Obj_t * Ivy_Mux( Ivy_Man_t * p, Ivy_Obj_t * pC, Ivy_Obj_t * p1, Ivy_Obj_t * p0 )
{
    Ivy_Obj_t * pTempA1, * pTempA2, * pTempB1, * pTempB2, * pTemp;
    int Count0, Count1;
    // consider trivial cases
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Exor( p, pC, p0 );
    // other cases can be added
    // implement the first MUX (F = C * x1 + C' * x0)
    pTempA1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          p1, IVY_AND, IVY_INIT_NONE) );
    pTempA2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), p0, IVY_AND, IVY_INIT_NONE) );
    if ( pTempA1 && pTempA2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempA1), Ivy_Not(pTempA2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return Ivy_Not(pTemp);
    }
    Count0 = (pTempA1 != NULL) + (pTempA2 != NULL);
    // implement the second MUX (F' = C * x1' + C' * x0')
    pTempB1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          Ivy_Not(p1), IVY_AND, IVY_INIT_NONE) );
    pTempB2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), Ivy_Not(p0), IVY_AND, IVY_INIT_NONE) );
    if ( pTempB1 && pTempB2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempB1), Ivy_Not(pTempB2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return pTemp;
    }
    Count1 = (pTempB1 != NULL) + (pTempB2 != NULL);
    // compare and decide which one to implement
    if ( Count0 >= Count1 )
    {
        pTempA1 = pTempA1? pTempA1 : Ivy_And(p, pC,          p1);
        pTempA2 = pTempA2? pTempA2 : Ivy_And(p, Ivy_Not(pC), p0);
        return Ivy_Or( p, pTempA1, pTempA2 );
    }
    pTempB1 = pTempB1? pTempB1 : Ivy_And(p, pC,          Ivy_Not(p1));
    pTempB2 = pTempB2? pTempB2 : Ivy_And(p, Ivy_Not(pC), Ivy_Not(p0));
    return Ivy_Not( Ivy_Or( p, pTempB1, pTempB2 ) );

//    return Ivy_Or( Ivy_And(pC, p1), Ivy_And(Ivy_Not(pC), p0) );
}